

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzerSettings.cpp
# Opt level: O0

bool __thiscall USBAnalyzerSettings::SetSettingsFromInterfaces(USBAnalyzerSettings *this)

{
  byte bVar1;
  ulong uVar2;
  double dVar3;
  Channel local_88 [16];
  Channel local_78 [16];
  Channel local_68 [16];
  Channel local_58 [32];
  Channel local_38 [16];
  Channel local_28 [16];
  USBAnalyzerSettings *local_18;
  USBAnalyzerSettings *this_local;
  
  local_18 = this;
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::Channel(local_38,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  bVar1 = Channel::operator==(local_28,local_38);
  Channel::~Channel(local_38);
  Channel::~Channel(local_28);
  if ((bVar1 & 1) == 0) {
    AnalyzerSettingInterfaceChannel::GetChannel();
    Channel::Channel(local_68,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    bVar1 = Channel::operator==(local_58,local_68);
    Channel::~Channel(local_68);
    Channel::~Channel(local_58);
    if ((bVar1 & 1) == 0) {
      AnalyzerSettingInterfaceChannel::GetChannel();
      Channel::operator=(&this->mDPChannel,local_78);
      Channel::~Channel(local_78);
      AnalyzerSettingInterfaceChannel::GetChannel();
      Channel::operator=(&this->mDMChannel,local_88);
      Channel::~Channel(local_88);
      dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
      this->mSpeed = (int)dVar3;
      dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
      this->mDecodeLevel = (int)dVar3;
      uVar2 = Channel::operator==(&this->mDMChannel,&this->mDPChannel);
      if ((uVar2 & 1) == 0) {
        AnalyzerSettings::ClearChannels();
        AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mDPChannel,true);
        AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mDMChannel,true);
        this_local._7_1_ = true;
      }
      else {
        AnalyzerSettings::SetErrorText((char *)this);
        this_local._7_1_ = false;
      }
    }
    else {
      AnalyzerSettings::SetErrorText((char *)this);
      this_local._7_1_ = false;
    }
  }
  else {
    AnalyzerSettings::SetErrorText((char *)this);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool USBAnalyzerSettings::SetSettingsFromInterfaces()
{
    if( mDPChannelInterface.GetChannel() == UNDEFINED_CHANNEL )
    {
        SetErrorText( "Please select an input for the D+ channel." );
        return false;
    }

    if( mDMChannelInterface.GetChannel() == UNDEFINED_CHANNEL )
    {
        SetErrorText( "Please select an input for the D- channel." );
        return false;
    }

    mDPChannel = mDPChannelInterface.GetChannel();
    mDMChannel = mDMChannelInterface.GetChannel();
    mSpeed = USBSpeed( int( mSpeedInterface.GetNumber() ) );
    mDecodeLevel = USBDecodeLevel( int( mDecodeLevelInterface.GetNumber() ) );

    if( mDMChannel == mDPChannel )
    {
        SetErrorText( "Please select different inputs for the D- and D+ channels." );
        return false;
    }

    ClearChannels();

    AddChannel( mDPChannel, "D+", true );
    AddChannel( mDMChannel, "D-", true );

    return true;
}